

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::changeEvent(QTreeView *this,QEvent *event)

{
  long lVar1;
  QWidget *this_00;
  undefined4 uVar2;
  QStyle *pQVar3;
  
  if ((*(short *)(event + 8) == 100) &&
     (lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget.field_0x8, *(char *)(lVar1 + 0x5c6) == '\0')) {
    this_00 = *(QWidget **)(lVar1 + 8);
    pQVar3 = QWidget::style(this_00);
    uVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x58,0,this_00);
    *(undefined4 *)(lVar1 + 0x598) = uVar2;
  }
  QFrame::changeEvent((QFrame *)this,event);
  return;
}

Assistant:

void QTreeView::changeEvent(QEvent *event)
{
    Q_D(QTreeView);
    if (event->type() == QEvent::StyleChange) {
        if (!d->customIndent) {
            // QAbstractItemView calls this method in case of a style change,
            // so update the indentation here if it wasn't set manually.
            d->updateIndentationFromStyle();
        }
    }
    QAbstractItemView::changeEvent(event);
}